

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsRbTree.h
# Opt level: O3

void __thiscall
highs::RbTree<HighsNodeQueue::NodeHybridEstimRbTree>::transplant
          (RbTree<HighsNodeQueue::NodeHybridEstimRbTree> *this,LinkType u,LinkType v,
          LinkType *nilParent)

{
  long lVar1;
  LinkType *pLVar2;
  long lVar3;
  ulong uVar4;
  
  lVar1 = this[2].rootNode[1];
  uVar4 = *(ulong *)(lVar1 + 0x88 + u * 0x90) & 0x7fffffffffffffff;
  if (uVar4 == 0) {
    pLVar2 = this->rootNode;
  }
  else {
    lVar3 = (uVar4 - 1) * 0x90;
    pLVar2 = (LinkType *)(lVar1 + lVar3 + (ulong)(*(long *)(lVar1 + 0x78 + lVar3) != u) * 8 + 0x78);
  }
  *pLVar2 = v;
  if (v == -1) {
    *nilParent = uVar4 - 1;
  }
  else {
    *(ulong *)(lVar1 + 0x88 + v * 0x90) =
         *(ulong *)(lVar1 + 0x88 + v * 0x90) & 0x8000000000000000 | uVar4;
  }
  return;
}

Assistant:

void transplant(LinkType u, LinkType v, LinkType& nilParent) {
    LinkType p = getParent(u);

    if (p == kNoLink)
      rootNode = v;
    else
      setChild(p, Dir(u != getChild(p, kLeft)), v);

    if (v == kNoLink)
      nilParent = p;
    else
      setParent(v, p);
  }